

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HandleManager.cpp
# Opt level: O0

BasicHandleInfo * __thiscall
helics::HandleManager::addHandle
          (HandleManager *this,GlobalFederateId fed_id,InterfaceType what,string_view key,
          string_view type,string_view units)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  string actKey;
  InterfaceHandle local_id;
  int32_t in_stack_00000394;
  BasicHandleInfo *in_stack_00000398;
  HandleManager *in_stack_000003a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  InterfaceHandle *in_stack_ffffffffffffff80;
  GlobalFederateId *__args;
  allocator<char> *__a;
  undefined7 in_stack_ffffffffffffffa0;
  InterfaceType in_stack_ffffffffffffffa7;
  HandleManager *in_stack_ffffffffffffffa8;
  InterfaceHandle local_49 [8];
  InterfaceHandle local_28 [4];
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  __args = (GlobalFederateId *)&stack0x00000018;
  __a = (allocator<char> *)&stack0x00000008;
  sVar2 = std::deque<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>::size
                    ((deque<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_> *)
                     0x632d5b);
  InterfaceHandle::InterfaceHandle(local_28,(BaseType)sVar2);
  bVar1 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_18);
  if (bVar1) {
    generateName_abi_cxx11_(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa7);
  }
  else {
    in_stack_ffffffffffffff80 = local_49;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),in_RDI,__a);
    std::allocator<char>::~allocator((allocator<char> *)local_49);
  }
  std::deque<helics::BasicHandleInfo,std::allocator<helics::BasicHandleInfo>>::
  emplace_back<helics::GlobalFederateId&,helics::InterfaceHandle_const&,helics::InterfaceType&,std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
            ((deque<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_> *)__a,__args,
             in_stack_ffffffffffffff80,
             (InterfaceType *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
             in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
             (basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
  pvVar3 = std::deque<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>::back
                     ((deque<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_> *)
                      in_stack_ffffffffffffff70);
  InterfaceHandle::baseValue(local_28);
  addSearchFields(in_stack_000003a0,in_stack_00000398,in_stack_00000394);
  pvVar3 = std::deque<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>::back
                     ((deque<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_> *)
                      pvVar3);
  std::__cxx11::string::~string(in_stack_ffffffffffffff60);
  return pvVar3;
}

Assistant:

BasicHandleInfo& HandleManager::addHandle(GlobalFederateId fed_id,
                                          InterfaceType what,
                                          std::string_view key,
                                          std::string_view type,
                                          std::string_view units)
{
    const InterfaceHandle local_id(static_cast<InterfaceHandle::BaseType>(handles.size()));
    const std::string actKey = (!key.empty()) ? std::string(key) : generateName(what);
    handles.emplace_back(fed_id, local_id, what, actKey, type, units);
    addSearchFields(handles.back(), local_id.baseValue());
    return handles.back();
}